

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_set_file_times(char *pFilename,time_t access_time,time_t modified_time)

{
  int iVar1;
  char *in_RDI;
  utimbuf t;
  utimbuf local_28 [2];
  
  iVar1 = utime(in_RDI,local_28);
  return (mz_bool)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static mz_bool mz_zip_set_file_times(const char* pFilename, time_t access_time, time_t modified_time) {
#ifndef MINIZ_NO_TIME
  struct utimbuf t;
  t.actime = access_time;
  t.modtime = modified_time;
  return !utime(pFilename, &t);
#else
  (void)pFilename, (void)access_time, (void)modified_time;
  return MZ_TRUE;
#endif  // #ifndef MINIZ_NO_TIME
}